

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asmap.cpp
# Opt level: O2

vector<bool,_std::allocator<bool>_> *
DecodeAsmap(vector<bool,_std::allocator<bool>_> *__return_storage_ptr__,path path)

{
  long lVar1;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  undefined8 uVar2;
  _Bit_type *p_Var3;
  _Bit_type *p_Var4;
  bool bVar5;
  byte bVar6;
  FILE *__stream;
  long lVar7;
  Logger *pLVar8;
  _Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  *in_RCX;
  int bit;
  uint uVar9;
  int i;
  int iVar10;
  path *in_RSI;
  int *in_R8;
  long in_FS_OFFSET;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  int length;
  _Vector_base<std::byte,_std::allocator<std::byte>_> local_178;
  AutoFile local_158;
  string *local_130;
  undefined2 local_128;
  vector<bool,_std::allocator<bool>_> bits;
  string local_f8 [4];
  string local_78;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  bits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  bits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  bits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  bits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage
       = (_Bit_pointer)0x0;
  __stream = fsbridge::fopen((char *)in_RSI,"rb");
  local_158.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158.m_file = (FILE *)__stream;
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base(&local_178);
  if ((FILE *)local_158.m_file == (FILE *)0x0) {
    pLVar8 = LogInstance();
    bVar5 = BCLog::Logger::Enabled(pLVar8);
    if (bVar5) {
      log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
      log_msg._M_string_length = 0;
      log_msg.field_2._M_local_buf[0] = '\0';
      tinyformat::format<>(&local_78,"Failed to open asmap file from disk\n");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&log_msg,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      pLVar8 = LogInstance();
      local_78._M_dataplus._M_p = (pointer)0x57;
      local_78._M_string_length = 0x737cb2;
      source_file_01._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/util/asmap.cpp"
      ;
      source_file_01._M_len = 0x57;
      str_01._M_str = log_msg._M_dataplus._M_p;
      str_01._M_len = log_msg._M_string_length;
      logging_function_01._M_str = "DecodeAsmap";
      logging_function_01._M_len = 0xb;
      BCLog::Logger::LogPrintStr(pLVar8,str_01,logging_function_01,source_file_01,0xcb,ALL,Info);
      std::__cxx11::string::~string((string *)&log_msg);
    }
  }
  else {
    fseek(__stream,0,2);
    lVar7 = ftell(__stream);
    length = (int)lVar7;
    std::filesystem::__cxx11::path::string(local_f8,in_RSI);
    local_128 = 0x2622;
    local_130 = local_f8;
    pLVar8 = LogInstance();
    bVar5 = BCLog::Logger::Enabled(pLVar8);
    if (bVar5) {
      log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
      log_msg._M_string_length = 0;
      log_msg.field_2._M_local_buf[0] = '\0';
      tinyformat::format<std::__detail::_Quoted_string<std::__cxx11::string_const&,char>,int>
                (&local_78,(tinyformat *)"Opened asmap file %s (%d bytes) from disk\n",
                 (char *)&local_130,
                 (_Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
                  *)&length,in_R8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&log_msg,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      pLVar8 = LogInstance();
      local_78._M_dataplus._M_p = (pointer)0x57;
      local_78._M_string_length = 0x737cb2;
      in_RCX = (_Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
                *)0xb;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/util/asmap.cpp"
      ;
      source_file._M_len = 0x57;
      str._M_str = log_msg._M_dataplus._M_p;
      str._M_len = log_msg._M_string_length;
      logging_function._M_str = "DecodeAsmap";
      logging_function._M_len = 0xb;
      BCLog::Logger::LogPrintStr(pLVar8,str,logging_function,source_file,0xd0,ALL,Info);
      std::__cxx11::string::~string((string *)&log_msg);
    }
    std::__cxx11::string::~string((string *)local_f8);
    fseek(__stream,0,0);
    for (iVar10 = 0; iVar10 < length; iVar10 = iVar10 + 1) {
      bVar6 = ser_readdata8<AutoFile>(&local_158);
      for (uVar9 = 0; uVar9 != 8; uVar9 = uVar9 + 1) {
        std::vector<bool,_std::allocator<bool>_>::push_back
                  (&bits,(bVar6 >> (uVar9 & 0x1f) & 1) != 0);
      }
    }
    bVar5 = SanityCheckASMap(&bits,0x80);
    if (!bVar5) {
      std::filesystem::__cxx11::path::string(local_f8,in_RSI);
      local_128 = 0x2622;
      local_130 = local_f8;
      pLVar8 = LogInstance();
      bVar5 = BCLog::Logger::Enabled(pLVar8);
      if (bVar5) {
        log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
        log_msg._M_string_length = 0;
        log_msg.field_2._M_local_buf[0] = '\0';
        tinyformat::format<std::__detail::_Quoted_string<std::__cxx11::string_const&,char>>
                  (&local_78,(tinyformat *)"Sanity check of asmap file %s failed\n",
                   (char *)&local_130,in_RCX);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&log_msg,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        pLVar8 = LogInstance();
        local_78._M_dataplus._M_p = (pointer)0x57;
        local_78._M_string_length = 0x737cb2;
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/util/asmap.cpp"
        ;
        source_file_00._M_len = 0x57;
        str_00._M_str = log_msg._M_dataplus._M_p;
        str_00._M_len = log_msg._M_string_length;
        logging_function_00._M_str = "DecodeAsmap";
        logging_function_00._M_len = 0xb;
        BCLog::Logger::LogPrintStr(pLVar8,str_00,logging_function_00,source_file_00,0xda,ALL,Info);
        std::__cxx11::string::~string((string *)&log_msg);
      }
      std::__cxx11::string::~string((string *)local_f8);
      (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      *(undefined8 *)
       &(__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
      (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      *(undefined8 *)
       &(__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
      (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
      super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
      goto LAB_0061bbcc;
    }
  }
  p_Var4 = bits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_p;
  p_Var3 = bits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
           .super__Bit_iterator_base._M_p;
  uVar2 = CONCAT44(bits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_start.super__Bit_iterator_base._12_4_,
                   bits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_start.super__Bit_iterator_base._M_offset);
  bits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  bits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_end_of_storage =
       bits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_end_of_storage;
  bits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = p_Var4;
  *(ulong *)&(__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset =
       CONCAT44(bits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_finish.super__Bit_iterator_base._12_4_,
                bits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_finish.super__Bit_iterator_base._M_offset);
  bits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = p_Var3;
  *(undefined8 *)
   &(__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = uVar2;
  bits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage
       = (_Bit_pointer)0x0;
LAB_0061bbcc:
  AutoFile::~AutoFile(&local_158);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&bits.super__Bvector_base<std::allocator<bool>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<bool> DecodeAsmap(fs::path path)
{
    std::vector<bool> bits;
    FILE *filestr = fsbridge::fopen(path, "rb");
    AutoFile file{filestr};
    if (file.IsNull()) {
        LogPrintf("Failed to open asmap file from disk\n");
        return bits;
    }
    fseek(filestr, 0, SEEK_END);
    int length = ftell(filestr);
    LogPrintf("Opened asmap file %s (%d bytes) from disk\n", fs::quoted(fs::PathToString(path)), length);
    fseek(filestr, 0, SEEK_SET);
    uint8_t cur_byte;
    for (int i = 0; i < length; ++i) {
        file >> cur_byte;
        for (int bit = 0; bit < 8; ++bit) {
            bits.push_back((cur_byte >> bit) & 1);
        }
    }
    if (!SanityCheckASMap(bits, 128)) {
        LogPrintf("Sanity check of asmap file %s failed\n", fs::quoted(fs::PathToString(path)));
        return {};
    }
    return bits;
}